

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkTestResult
          (TestStatus *__return_storage_ptr__,BlittingImages *this,ConstPixelBufferAccess *result)

{
  bool bVar1;
  TextureFormat *pTVar2;
  TextureLevel *pTVar3;
  allocator<char> local_4a1;
  string local_4a0;
  ConstPixelBufferAccess local_480;
  PixelBufferAccess local_458;
  ConstPixelBufferAccess local_430;
  undefined1 local_408 [8];
  ConstPixelBufferAccess stencilSource;
  ConstPixelBufferAccess stencilResult_1;
  DepthStencilMode mode_3;
  ConstPixelBufferAccess local_388;
  undefined1 local_360 [8];
  ConstPixelBufferAccess depthSource;
  ConstPixelBufferAccess depthResult_1;
  DepthStencilMode mode_2;
  ConstPixelBufferAccess local_2e0;
  TextureFormat local_2b8;
  TextureFormat sourceFormat_2;
  TextureFormat local_2a8;
  TextureFormat sourceFormat_1;
  ConstPixelBufferAccess local_278;
  undefined1 local_250 [8];
  ConstPixelBufferAccess unclampedExpected_1;
  ConstPixelBufferAccess local_200;
  undefined1 local_1d8 [8];
  ConstPixelBufferAccess clampedExpected_1;
  ConstPixelBufferAccess stencilResult;
  DepthStencilMode mode_1;
  TextureFormat local_178;
  TextureFormat sourceFormat;
  ConstPixelBufferAccess local_148;
  undefined1 local_120 [8];
  ConstPixelBufferAccess unclampedExpected;
  ConstPixelBufferAccess local_d0;
  undefined1 local_a8 [8];
  ConstPixelBufferAccess clampedExpected;
  ConstPixelBufferAccess depthResult;
  DepthStencilMode mode;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string failMessage;
  ConstPixelBufferAccess *result_local;
  BlittingImages *this_local;
  
  failMessage.field_2._8_8_ = result;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"Result image is incorrect",&local_41);
  std::allocator<char>::~allocator(&local_41);
  if ((this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter == VK_FILTER_LINEAR) {
    pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
    bVar1 = tcu::isCombinedDepthStencilType(pTVar2->type);
    if (bVar1) {
      pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
      bVar1 = tcu::hasDepthComponent(pTVar2->order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&clampedExpected.m_data,result,MODE_DEPTH);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&unclampedExpected.m_data,pTVar3);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&local_d0,(PixelBufferAccess *)&unclampedExpected.m_data,
                   MODE_DEPTH);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_a8,&local_d0);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->m_unclampedExpectedTextureLevel).
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&sourceFormat,pTVar3);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&local_148,(PixelBufferAccess *)&sourceFormat,MODE_DEPTH);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_120,&local_148);
        _mode_1 = ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.
                                    format);
        local_178 = tcu::getEffectiveDepthStencilTextureFormat((TextureFormat *)&mode_1,MODE_DEPTH);
        bVar1 = checkLinearFilteredResult
                          (this,(ConstPixelBufferAccess *)&clampedExpected.m_data,
                           (ConstPixelBufferAccess *)local_a8,(ConstPixelBufferAccess *)local_120,
                           &local_178);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
          goto LAB_008af989;
        }
      }
      pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
      bVar1 = tcu::hasStencilComponent(pTVar2->order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&clampedExpected_1.m_data,result,MODE_STENCIL);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&unclampedExpected_1.m_data,pTVar3);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&local_200,(PixelBufferAccess *)&unclampedExpected_1.m_data,
                   MODE_STENCIL);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_1d8,&local_200);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->m_unclampedExpectedTextureLevel).
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&sourceFormat_1,pTVar3);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&local_278,(PixelBufferAccess *)&sourceFormat_1,MODE_STENCIL
                  );
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_250,&local_278);
        sourceFormat_2 =
             ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format
                              );
        local_2a8 = tcu::getEffectiveDepthStencilTextureFormat(&sourceFormat_2,MODE_STENCIL);
        bVar1 = checkLinearFilteredResult
                          (this,(ConstPixelBufferAccess *)&clampedExpected_1.m_data,
                           (ConstPixelBufferAccess *)local_1d8,(ConstPixelBufferAccess *)local_250,
                           &local_2a8);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
          goto LAB_008af989;
        }
      }
    }
    else {
      local_2b8 = ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.
                                    format);
      pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&(this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_2e0,pTVar3);
      pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&(this->m_unclampedExpectedTextureLevel).
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&stack0xfffffffffffffcf8,pTVar3);
      bVar1 = checkLinearFilteredResult
                        (this,result,&local_2e0,(ConstPixelBufferAccess *)&stack0xfffffffffffffcf8,
                         &local_2b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
        goto LAB_008af989;
      }
    }
  }
  else {
    pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
    bVar1 = tcu::isCombinedDepthStencilType(pTVar2->type);
    if (bVar1) {
      pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
      bVar1 = tcu::hasDepthComponent(pTVar2->order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&depthSource.m_data,result,MODE_DEPTH);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&stack0xfffffffffffffc50,pTVar3);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&local_388,(PixelBufferAccess *)&stack0xfffffffffffffc50,
                   MODE_DEPTH);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_360,&local_388);
        bVar1 = checkNearestFilteredResult
                          (this,(ConstPixelBufferAccess *)&depthSource.m_data,
                           (ConstPixelBufferAccess *)local_360);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
          goto LAB_008af989;
        }
      }
      pTVar2 = tcu::ConstPixelBufferAccess::getFormat(result);
      bVar1 = tcu::hasStencilComponent(pTVar2->order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&stencilSource.m_data,result,MODE_STENCIL);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess(&local_458,pTVar3);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_430,&local_458,MODE_STENCIL)
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_408,&local_430);
        bVar1 = checkNearestFilteredResult
                          (this,(ConstPixelBufferAccess *)&stencilSource.m_data,
                           (ConstPixelBufferAccess *)local_408);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
          goto LAB_008af989;
        }
      }
    }
    else {
      pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&(this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_480,pTVar3);
      bVar1 = checkNearestFilteredResult(this,result,&local_480);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_40);
        goto LAB_008af989;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Pass",&local_4a1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
LAB_008af989:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlittingImages::checkTestResult (tcu::ConstPixelBufferAccess result)
{
	DE_ASSERT(m_params.filter == VK_FILTER_NEAREST || m_params.filter == VK_FILTER_LINEAR);
	const std::string failMessage("Result image is incorrect");

	if (m_params.filter == VK_FILTER_LINEAR)
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult			= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(depthResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(stencilResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			const tcu::TextureFormat	sourceFormat	= mapVkFormat(m_params.src.image.format);

			if (!checkLinearFilteredResult(result, m_expectedTextureLevel->getAccess(), m_unclampedExpectedTextureLevel->getAccess(), sourceFormat))
				return tcu::TestStatus::fail(failMessage);
		}
	}
	else // NEAREST filtering
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		depthSource		= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(depthResult, depthSource))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult	= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		stencilSource	= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(stencilResult, stencilSource))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			if (!checkNearestFilteredResult(result, m_sourceTextureLevel->getAccess()))
				return tcu::TestStatus::fail(failMessage);
		}
	}

	return tcu::TestStatus::pass("Pass");
}